

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O0

void __thiscall SDT::Unary::Unary(Unary *this)

{
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  Unary *local_10;
  Unary *this_local;
  
  local_10 = this;
  SDTNode::SDTNode(&this->super_SDTNode);
  (this->super_SDTNode)._vptr_SDTNode = (_func_int **)&PTR_dfs_0014b968;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->code,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->addr,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->op,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  this->gotoTrue = 0;
  this->gotoFalse = 0;
  return;
}

Assistant:

virtual void dfs(TreeNode &treeNode,SDTNode *fa) {
            if (treeNode.sons.empty()) {
                return;
            }
            if(treeNode.opt<=1){
                Unary *unary_1 = new Unary;
                sons.push_back(unary_1);
                unary_1->dfs(SON(1));
                addr = newtemp();
                if(treeNode.opt==0) gen("not",unary_1->addr,"_",addr);
                else gen("neg",unary_1->addr,"_",addr);
            }else if(treeNode.opt==2){
                Factor *factor_1 = new Factor;
                sons.push_back(factor_1);
                factor_1->dfs(SON(0));
                addr = factor_1->addr;
            }
        }